

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaIsParticleEmptiable(xmlSchemaParticlePtr particle)

{
  xmlSchemaParticlePtr particle_local;
  
  if (((particle == (xmlSchemaParticlePtr)0x0) || (particle->minOccurs == 0)) ||
     (particle->children == (xmlSchemaTreeItemPtr_conflict)0x0)) {
    particle_local._4_4_ = 1;
  }
  else if (((particle->children->type == XML_SCHEMA_TYPE_SEQUENCE) ||
           (particle->children->type == XML_SCHEMA_TYPE_CHOICE)) ||
          (particle->children->type == XML_SCHEMA_TYPE_ALL)) {
    particle_local._4_4_ = xmlSchemaGetParticleEmptiable(particle);
  }
  else {
    particle_local._4_4_ = 0;
  }
  return particle_local._4_4_;
}

Assistant:

static int
xmlSchemaIsParticleEmptiable(xmlSchemaParticlePtr particle)
{
    /*
    * SPEC (1) "Its {min occurs} is 0."
    */
    if ((particle == NULL) || (particle->minOccurs == 0) ||
	(particle->children == NULL))
	return (1);
    /*
    * SPEC (2) "Its {term} is a group and the minimum part of the
    * effective total range of that group, [...] is 0."
    */
    if (WXS_IS_MODEL_GROUP(particle->children))
	return (xmlSchemaGetParticleEmptiable(particle));
    return (0);
}